

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

void GetPopulationInfo(VP8LHistogram *histo,HistogramIndex index,uint32_t **population,int *length)

{
  int iVar1;
  uint32_t *puVar2;
  
  switch(index) {
  case LITERAL:
    *population = histo->literal;
    iVar1 = (1 << ((byte)histo->palette_code_bits & 0x1f)) + 0x118;
    if (histo->palette_code_bits < 1) {
      iVar1 = 0x118;
    }
    goto LAB_00137c70;
  case RED:
    puVar2 = histo->red;
    break;
  case BLUE:
    puVar2 = histo->blue;
    break;
  case ALPHA:
    puVar2 = histo->alpha;
    break;
  case DISTANCE:
    *population = histo->distance;
    iVar1 = 0x28;
    goto LAB_00137c70;
  default:
    goto switchD_00137c22_default;
  }
  *population = puVar2;
  iVar1 = 0x100;
LAB_00137c70:
  *length = iVar1;
switchD_00137c22_default:
  return;
}

Assistant:

static WEBP_INLINE void GetPopulationInfo(const VP8LHistogram* const histo,
                                          HistogramIndex index,
                                          const uint32_t** population,
                                          int* length) {
  switch (index) {
    case LITERAL:
      *population = histo->literal;
      *length = VP8LHistogramNumCodes(histo->palette_code_bits);
      break;
    case RED:
      *population = histo->red;
      *length = NUM_LITERAL_CODES;
      break;
    case BLUE:
      *population = histo->blue;
      *length = NUM_LITERAL_CODES;
      break;
    case ALPHA:
      *population = histo->alpha;
      *length = NUM_LITERAL_CODES;
      break;
    case DISTANCE:
      *population = histo->distance;
      *length = NUM_DISTANCE_CODES;
      break;
  }
}